

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O2

uint32_t helper_vjcvt_arm(float64 value,CPUARMState *env)

{
  uint64_t uVar1;
  
  uVar1 = helper_fjcvtzs_arm(value,&(env->vfp).fp_status);
  (env->vfp).xregs[1] = (uint)(uVar1 >> 0x20 == 0) << 0x1e | (env->vfp).xregs[1] & 0xfffffff;
  return (uint32_t)uVar1;
}

Assistant:

uint32_t HELPER(vjcvt)(float64 value, CPUARMState *env)
{
    uint64_t pair = HELPER(fjcvtzs)(value, &env->vfp.fp_status);
    uint32_t result = pair;
    uint32_t z = (pair >> 32) == 0;

    /* Store Z, clear NCV, in FPSCR.NZCV.  */
    env->vfp.xregs[ARM_VFP_FPSCR]
        = (env->vfp.xregs[ARM_VFP_FPSCR] & ~CPSR_NZCV) | (z * CPSR_Z);

    return result;
}